

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::resizeErase
          (Array2D<Imf_3_2::PreviewRgba> *this,long sizeX,long sizeY)

{
  PreviewRgba *pPVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = sizeY * sizeX;
  pPVar1 = (PreviewRgba *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
  if (uVar3 != 0) {
    lVar2 = 0;
    do {
      *(undefined4 *)(&pPVar1->r + lVar2) = 0xff000000;
      lVar2 = lVar2 + 4;
    } while (uVar3 * 4 - lVar2 != 0);
  }
  if (this->_data != (PreviewRgba *)0x0) {
    operator_delete__(this->_data);
  }
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  this->_data = pPVar1;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}